

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_floorf.c
# Opt level: O0

float wasm_floorf(float x)

{
  int iVar1;
  uint uVar2;
  ieee_float_shape_type sf_u;
  ieee_float_shape_type gf_u;
  uint32_t i;
  int32_t jj0;
  int32_t i0;
  float x_local;
  
  iVar1 = ((int)x >> 0x17 & 0xffU) - 0x7f;
  if (iVar1 < 0x17) {
    i = (uint32_t)x;
    if (iVar1 < 0) {
      if (0.0 < x + 1e+30) {
        if ((int)x < 0) {
          if (ABS(x) != 0.0) {
            i = 0xbf800000;
          }
        }
        else {
          i = 0;
        }
      }
    }
    else {
      uVar2 = 0x7fffff >> ((byte)iVar1 & 0x1f);
      if (((uint)x & uVar2) == 0) {
        return x;
      }
      if (0.0 < x + 1e+30) {
        if ((int)x < 0) {
          i = (0x800000 >> ((byte)iVar1 & 0x1f)) + (int)x;
        }
        i = (uVar2 ^ 0xffffffff) & i;
      }
    }
    i0 = i;
  }
  else {
    i0 = (int32_t)x;
    if (iVar1 == 0x80) {
      i0 = (int32_t)(x + x);
    }
  }
  return (float)i0;
}

Assistant:

float wasm_floorf(float x)
{
	int32_t i0,jj0;
	uint32_t i;

    GET_FLOAT_WORD(i0,x);

    jj0 = ((i0>>23)&0xff)-0x7f;
	if(jj0<23) {
	    if(jj0<0) { 	/* raise inexact if x != 0 */
		if(wasm_hugef+x>(float)0.0) {/* return 0*sign(x) if |x|<1 */
		    if(i0>=0) {i0=0;} 
		    else if((i0&0x7fffffff)!=0)
			{ i0=0xbf800000;}
		}
	    } else {
		i = (0x007fffff)>>jj0;
		if((i0&i)==0) return x; /* x is integral */
		if(wasm_hugef+x>(float)0.0) {	/* raise inexact flag */
		    if(i0<0) i0 += (0x00800000)>>jj0;
		    i0 &= (~i);
		}
	    }
	} else {
	    if(jj0==0x80) return x+x;	/* inf or NaN */
	    else return x;		/* x is integral */
	}
	SET_FLOAT_WORD(x,i0);
	return x;
}